

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_ApproximateInequivalencyTest_Test::TestBody
          (MessageDifferencerTest_ApproximateInequivalencyTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_780;
  AssertHelper local_760;
  Message local_758;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__2;
  float v2;
  float v1;
  AssertHelper local_710;
  Message local_708;
  bool local_6f9;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_6c8;
  Message local_6c0;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_690 [8];
  TestAllTypes msg2;
  TestAllTypes msg1;
  MessageDifferencerTest_ApproximateInequivalencyTest_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::set_optional_int32
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328),-1);
  bVar1 = util::MessageDifferencer::ApproximatelyEquivalent
                    ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  local_6b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_6b0,
               (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x3bc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  proto2_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)((long)&msg2.field_0 + 0x328),0)
  ;
  proto2_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)local_690,0);
  local_6f9 = util::MessageDifferencer::ApproximatelyEquivalent
                        ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f8,&local_6f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&v2,(internal *)local_6f8,
               (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x3c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_710,&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    std::__cxx11::string::~string((string *)&v2);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x40133333;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x4114cccd;
  proto2_unittest::TestAllTypes::set_optional_float
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328),2.3);
  proto2_unittest::TestAllTypes::set_optional_float((TestAllTypes *)local_690,9.3);
  bVar1 = util::MessageDifferencer::ApproximatelyEquivalent
                    ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  local_749 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_748,&local_749,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_780,(internal *)local_748,
               (AssertionResult *)"util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x3c8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  return;
}

Assistant:

TEST(MessageDifferencerTest, ApproximateInequivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  // Should fail on equivalency
  msg1.set_optional_int32(-1);
  EXPECT_FALSE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));

  // Make these fields the same again.
  msg1.set_optional_int32(0);
  msg2.set_optional_int32(0);
  EXPECT_TRUE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));

  // Should fail on approximate equality check
  const float v1 = 2.3f;
  const float v2 = 9.3f;
  msg1.set_optional_float(v1);
  msg2.set_optional_float(v2);
  EXPECT_FALSE(util::MessageDifferencer::ApproximatelyEquivalent(msg1, msg2));
}